

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O0

void do_write(uv_stream_t *stream,uv_write_cb cb)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t buf;
  uv_write_t *req;
  uv_write_cb cb_local;
  uv_stream_t *stream_local;
  
  buf.len = (size_t)malloc(200);
  eval_a = (int64_t)anon_var_dwarf_8b5fb;
  buf.base = (char *)0x8;
  iVar1 = uv_write(buf.len,stream,&eval_a,1,cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x35,"uv_write(req, stream, &buf, 1, cb)","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void do_write(uv_stream_t* handle) {
  struct write_info* write_info;
  uv_buf_t bufs[BUFFERS_PER_WRITE];
  size_t i;
  int r;

  write_info = malloc(sizeof *write_info);
  ASSERT_NOT_NULL(write_info);

  for (i = 0; i < BUFFERS_PER_WRITE; i++) {
    memset(&write_info->buffers[i], BUFFER_CONTENT, BUFFER_SIZE);
    bufs[i] = uv_buf_init(write_info->buffers[i], BUFFER_SIZE);
  }

  r = uv_write(
      &write_info->write_req, handle, bufs, BUFFERS_PER_WRITE, write_cb);
  ASSERT_OK(r);
}